

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O0

ssize_t __thiscall
sznet::net::TcpConnection::send(TcpConnection *this,int __fd,void *__buf,size_t __n,int __flags)

{
  EventLoop *this_00;
  bool bVar1;
  TcpConnection *extraout_RAX;
  undefined4 in_register_00000034;
  StringPiece local_a8 [2];
  TcpConnection *local_88;
  type local_80;
  Functor local_48;
  code *local_28;
  offset_in_TcpConnection_to_subr fp;
  StringPiece *local_18;
  StringPiece *message_local;
  TcpConnection *this_local;
  
  local_18 = (StringPiece *)CONCAT44(in_register_00000034,__fd);
  if (this->m_state == kConnected) {
    message_local = (StringPiece *)this;
    bVar1 = EventLoop::isInLoopThread(this->m_loop);
    if (bVar1) {
      sendInLoop(this,local_18);
      this = extraout_RAX;
    }
    else {
      local_28 = sendInLoop;
      fp = 0;
      this_00 = this->m_loop;
      local_88 = this;
      StringPiece::as_string_abi_cxx11_(local_a8);
      std::
      bind<void(sznet::net::TcpConnection::*&)(sznet::StringPiece_const&),sznet::net::TcpConnection*,std::__cxx11::string>
                (&local_80,(offset_in_TcpConnection_to_subr *)&local_28,&local_88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
      std::function<void()>::
      function<std::_Bind<void(sznet::net::TcpConnection::*(sznet::net::TcpConnection*,std::__cxx11::string))(sznet::StringPiece_const&)>,void>
                ((function<void()> *)&local_48,&local_80);
      EventLoop::runInLoop(this_00,&local_48);
      std::function<void_()>::~function(&local_48);
      std::
      _Bind<void_(sznet::net::TcpConnection::*(sznet::net::TcpConnection_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>))(const_sznet::StringPiece_&)>
      ::~_Bind(&local_80);
      this = (TcpConnection *)std::__cxx11::string::~string((string *)local_a8);
    }
  }
  return (ssize_t)this;
}

Assistant:

void TcpConnection::send(const StringPiece& message)
{
	if (m_state == kConnected)
	{
		if (m_loop->isInLoopThread())
		{
			sendInLoop(message);
		}
		else
		{
			void (TcpConnection::*fp)(const StringPiece& message) = &TcpConnection::sendInLoop;
			// FIXME std::forward<string>(message)
			m_loop->runInLoop(std::bind(fp, this, message.as_string()));
		}
	}
}